

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void windowReadPeerValues(WindowCodeArg *p,int csr,int reg)

{
  int iVar1;
  Window *pWVar2;
  ExprList *pEVar3;
  Vdbe *p_00;
  int iVar4;
  int iVar5;
  
  pWVar2 = p->pMWin;
  pEVar3 = pWVar2->pOrderBy;
  if (pEVar3 != (ExprList *)0x0) {
    p_00 = sqlite3GetVdbe(p->pParse);
    iVar1 = pWVar2->nBufferCol;
    iVar4 = 0;
    iVar5 = 0;
    if (pWVar2->pPartition != (ExprList *)0x0) {
      iVar5 = pWVar2->pPartition->nExpr;
    }
    for (; iVar4 < pEVar3->nExpr; iVar4 = iVar4 + 1) {
      sqlite3VdbeAddOp3(p_00,0x5e,csr,iVar5 + iVar1 + iVar4,reg + iVar4);
    }
  }
  return;
}

Assistant:

static void windowReadPeerValues(
  WindowCodeArg *p,
  int csr,
  int reg
){
  Window *pMWin = p->pMWin;
  ExprList *pOrderBy = pMWin->pOrderBy;
  if( pOrderBy ){
    Vdbe *v = sqlite3GetVdbe(p->pParse);
    ExprList *pPart = pMWin->pPartition;
    int iColOff = pMWin->nBufferCol + (pPart ? pPart->nExpr : 0);
    int i;
    for(i=0; i<pOrderBy->nExpr; i++){
      sqlite3VdbeAddOp3(v, OP_Column, csr, iColOff+i, reg+i);
    }
  }
}